

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O3

string_type * __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_quote_meta<char_const*>
          (string_type *__return_storage_ptr__,
          regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
          *this,char **begin,char *end)

{
  char *pcVar1;
  compiler_token_type cVar2;
  char *pcVar3;
  undefined **local_70 [2];
  undefined **local_60;
  refcount_ptr<boost::exception_detail::error_info_container> local_58;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  error_type local_38;
  
  pcVar1 = *begin;
  pcVar3 = pcVar1;
  if (pcVar1 != end) {
    do {
      cVar2 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              ::get_token<char_const*>
                        ((compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                          *)(this + 0x10),begin,end);
      if ((int)cVar2 < 6) {
        if (cVar2 != token_literal) {
          if (cVar2 != token_escape) goto LAB_0012b237;
          if (*begin == end) {
            std::runtime_error::runtime_error
                      ((runtime_error *)local_70,"incomplete escape sequence");
            local_58.px_ = (error_info_container *)0x0;
            local_70[0] = &PTR__regex_error_00193398;
            local_60 = &PTR__regex_error_001933c0;
            local_38 = error_escape;
            local_50 = 
            "string_type boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_quote_meta(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
            ;
            local_48 = 
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
            ;
            local_40._0_4_ = 0x2bf;
            local_40._4_4_ = -1;
            throw_exception<boost::xpressive::regex_error>((regex_error *)local_70);
          }
        }
LAB_0012b225:
        pcVar3 = *begin + 1;
        *begin = pcVar3;
      }
      else {
        if (cVar2 == token_invalid_quantifier) goto LAB_0012b225;
        if (cVar2 == token_quote_meta_end) break;
LAB_0012b237:
        pcVar3 = *begin;
      }
    } while (pcVar3 != end);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar1,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

string_type parse_quote_meta(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        FwdIter old_begin = begin, old_end;
        while(end != (old_end = begin))
        {
            switch(this->traits_.get_token(begin, end))
            {
            case token_quote_meta_end:
                return string_type(old_begin, old_end);
            case token_escape:
                BOOST_XPR_ENSURE_(begin != end, error_escape, "incomplete escape sequence");
                BOOST_FALLTHROUGH;
            case token_invalid_quantifier:
            case token_literal:
                ++begin;
                break;
            default:
                break;
            }
        }
        return string_type(old_begin, begin);
    }